

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsFreewheel::IntLoadConstraint_C
          (ChShaftsFreewheel *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double local_8;
  
  dVar1 = ((this->super_ChShaftsCouple).shaft1)->pos - ((this->super_ChShaftsCouple).shaft2)->pos;
  if (this->free_forward == true) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->phase;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = this->step;
    auVar12._0_8_ = (this->alpha_max - this->phase) / this->step;
    auVar12._8_8_ = 0;
    auVar6 = vroundsd_avx(auVar12,auVar12,9);
    auVar6 = vfmadd213sd_fma(auVar6,auVar10,auVar9);
    local_8 = (double)((ulong)!(bool)(this->jamming_mode & 1) * (long)(dVar1 - auVar6._0_8_)) * c;
    if (do_clamp) {
      auVar2._8_8_ = 0x8000000000000000;
      auVar2._0_8_ = 0x8000000000000000;
      auVar3._8_8_ = in_XMM1_Qb;
      auVar3._0_8_ = recovery_clamp;
      auVar6 = vxorpd_avx512vl(auVar3,auVar2);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_8;
      auVar6 = vmaxsd_avx(auVar8,auVar6);
      local_8 = auVar6._0_8_;
    }
  }
  else {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this->phase;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = this->step;
    auVar6._0_8_ = (this->phase - this->alpha_max) / this->step;
    auVar6._8_8_ = 0;
    auVar6 = vroundsd_avx(auVar6,auVar6,9);
    auVar6 = vfmsub213sd_fma(auVar6,auVar13,auVar11);
    local_8 = (double)((ulong)!(bool)(this->jamming_mode & 1) * (long)-(-dVar1 - auVar6._0_8_)) * c;
    if (do_clamp) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_8;
      auVar4._8_8_ = in_XMM1_Qb;
      auVar4._0_8_ = recovery_clamp;
      auVar6 = vminsd_avx(auVar7,auVar4);
      local_8 = auVar6._0_8_;
    }
  }
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,(ulong)off_L)
  ;
  *pSVar5 = local_8 + *pSVar5;
  return;
}

Assistant:

void ChShaftsFreewheel::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                       ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                       const double c,            // a scaling factor
                                       bool do_clamp,             // apply clamping to c*C?
                                       double recovery_clamp      // value for min/max clamping of c*C
                                       ) {

    double relrot =  this->shaft1->GetPos() - this->shaft2->GetPos();
    
    double res;

    if (this->free_forward)
        res = relrot - (this->phase + this->step * floor((alpha_max - this->phase) / this->step));
    else
        res = - (-relrot - (-this->phase + this->step * floor((-alpha_max + this->phase) / this->step)));

    if (jamming_mode) 
        res = 0;

    double cnstr_violation = c * res;

    if (do_clamp) {
        if (this->free_forward)
            cnstr_violation = ChMax(cnstr_violation, -recovery_clamp); 
        else
            cnstr_violation = ChMin(cnstr_violation,  recovery_clamp);
    }

    Qc(off_L) += cnstr_violation;
}